

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnInitExprRefNull(BinaryReaderIR *this,Index index)

{
  intrusive_list<wabt::Expr> *this_00;
  pointer *__ptr;
  Location loc;
  Expr *local_48;
  _Head_base<0UL,_wabt::Expr_*,_false> local_40;
  Location local_38;
  
  GetLocation(&local_38,this);
  this_00 = this->current_init_expr_;
  MakeUnique<wabt::ExprMixin<(wabt::ExprType)35>,wabt::Location&>((wabt *)&local_48,&local_38);
  local_40._M_head_impl = local_48;
  local_48 = (Expr *)0x0;
  intrusive_list<wabt::Expr>::push_back
            (this_00,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_40);
  if (local_40._M_head_impl != (Expr *)0x0) {
    (*(local_40._M_head_impl)->_vptr_Expr[1])();
  }
  local_40._M_head_impl = (Expr *)0x0;
  if (local_48 != (Expr *)0x0) {
    (**(code **)(*(long *)local_48 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnInitExprRefNull(Index index) {
  Location loc = GetLocation();
  current_init_expr_->push_back(MakeUnique<RefNullExpr>(loc));
  return Result::Ok;
}